

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_PCM.cpp
# Opt level: O2

h__Writer * __thiscall
AS_02::PCM::MXFWriter::h__Writer::OpenWrite
          (h__Writer *this,string *filename,FileDescriptor *essence_descriptor,
          InterchangeObject_list_t *essence_sub_descriptor_list,ui32_t *header_size)

{
  value_type *__x;
  bool bVar1;
  pointer pcVar2;
  byte_t *pbVar3;
  ILogSink *pIVar4;
  ui32_t *puVar5;
  undefined1 *puVar6;
  undefined4 *in_R9;
  Identifier<16U> local_138;
  Identifier<16U> local_118;
  Identifier<16U> local_f8;
  Identifier<16U> local_d8 [3];
  Identifier<16U> local_70;
  Identifier<16U> local_50;
  
  if (essence_sub_descriptor_list == (InterchangeObject_list_t *)0x0) {
    __assert_fail("essence_descriptor",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_PCM.cpp"
                  ,0x167,
                  "ASDCP::Result_t AS_02::PCM::MXFWriter::h__Writer::OpenWrite(const std::string &, ASDCP::MXF::FileDescriptor *, ASDCP::MXF::InterchangeObject_list_t &, const ui32_t &)"
                 );
  }
  pcVar2 = (pointer)__dynamic_cast(essence_sub_descriptor_list,&ASDCP::MXF::FileDescriptor::typeinfo
                                   ,&ASDCP::MXF::WaveAudioDescriptor::typeinfo,0);
  filename[0x2e]._M_dataplus._M_p = pcVar2;
  if (pcVar2 == (pointer)0x0) {
    pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar4,"Essence descriptor is not a WaveAudioDescriptor.\n");
    (*(code *)(essence_sub_descriptor_list->
              super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
              )._M_impl._M_node.super__List_node_base._M_next[8]._M_prev)
              (essence_sub_descriptor_list,0);
    puVar6 = RESULT_AS02_FORMAT;
  }
  else {
    if (*(int *)&filename[0x1b].field_2 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_d8,*(char **)essence_descriptor,(allocator<char> *)&local_138);
      Kumu::FileWriter::OpenWrite((string *)this);
      std::__cxx11::string::~string((string *)local_d8);
      if (*(int *)&(this->super_h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>).
                   super_h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR>.
                   super_TrackFileWriter<ASDCP::MXF::OP1aHeader>._vptr_TrackFileWriter < 0) {
        return this;
      }
      *(undefined4 *)&filename[2]._M_string_length = *in_R9;
      *(InterchangeObject_list_t **)((long)&filename[0x18].field_2 + 8) =
           essence_sub_descriptor_list;
      pcVar2 = filename[0x2e]._M_dataplus._M_p;
      *(undefined8 *)(pcVar2 + 0xf0) = *(undefined8 *)(pcVar2 + 0x158);
      puVar5 = header_size;
      while (puVar5 = *(ui32_t **)puVar5, puVar5 != header_size) {
        (**(code **)(**(long **)(puVar5 + 4) + 0x10))(local_d8);
        pbVar3 = (byte_t *)ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
        local_138.m_HasValue = true;
        local_138.m_Value._0_8_ = *(undefined8 *)pbVar3;
        local_138.m_Value._8_8_ = *(undefined8 *)(pbVar3 + 8);
        local_138.super_IArchive._vptr_IArchive = (_func_int **)&PTR__IArchive_00168cc8;
        bVar1 = Kumu::Identifier<16U>::operator!=(local_d8,&local_138);
        __x = (value_type *)(puVar5 + 4);
        if (bVar1) {
          (**(code **)(*(long *)*__x + 0x10))(&local_50);
          pbVar3 = (byte_t *)ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
          local_f8.m_HasValue = true;
          local_f8.m_Value._0_8_ = *(undefined8 *)pbVar3;
          local_f8.m_Value._8_8_ = *(undefined8 *)(pbVar3 + 8);
          local_f8.super_IArchive._vptr_IArchive = (_func_int **)&PTR__IArchive_00168cc8;
          bVar1 = Kumu::Identifier<16U>::operator!=(&local_50,&local_f8);
          if (bVar1) {
            (**(code **)(*(long *)*__x + 0x10))(&local_70);
            pbVar3 = (byte_t *)ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
            local_118.m_HasValue = true;
            local_118.m_Value._0_8_ = *(undefined8 *)pbVar3;
            local_118.m_Value._8_8_ = *(undefined8 *)(pbVar3 + 8);
            local_118.super_IArchive._vptr_IArchive = (_func_int **)&PTR__IArchive_00168cc8;
            bVar1 = Kumu::Identifier<16U>::operator!=(&local_70,&local_118);
            if (bVar1) {
              pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
              Kumu::ILogSink::Error
                        (pIVar4,"Essence sub-descriptor is not an MCALabelSubDescriptor.\n");
              (**(code **)(*(long *)*__x + 0x88))(*__x,0);
            }
          }
        }
        std::__cxx11::
        list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
        push_back((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                   *)(filename + 0x19),__x);
        Kumu::GenRandomValue((UUID *)(*__x + 0x58));
        std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::push_back
                  ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)
                   (*(long *)((long)&filename[0x18].field_2 + 8) + 200),(value_type *)(*__x + 0x58))
        ;
        *__x = (value_type)0x0;
      }
      ASDCP::MXF::h__WriterState::Goto_INIT((h__WriterState *)local_d8);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_d8);
      Kumu::Result_t::~Result_t((Result_t *)local_d8);
      return this;
    }
    puVar6 = Kumu::RESULT_STATE;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar6);
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::PCM::MXFWriter::h__Writer::OpenWrite(const std::string& filename, ASDCP::MXF::FileDescriptor* essence_descriptor,
					    ASDCP::MXF::InterchangeObject_list_t& essence_sub_descriptor_list, const ui32_t& header_size)
{
  assert(essence_descriptor);

  m_WaveAudioDescriptor = dynamic_cast<ASDCP::MXF::WaveAudioDescriptor*>(essence_descriptor);

  if ( m_WaveAudioDescriptor == 0 )
    {
      DefaultLogSink().Error("Essence descriptor is not a WaveAudioDescriptor.\n");
      essence_descriptor->Dump();
      return RESULT_AS02_FORMAT;
    }

  if ( ! m_State.Test_BEGIN() )
    {
      return RESULT_STATE;
    }

  Result_t result = m_File.OpenWrite(filename.c_str());

  if ( KM_SUCCESS(result) )
    {
      m_HeaderSize = header_size;
      m_EssenceDescriptor = essence_descriptor;
      m_WaveAudioDescriptor->SampleRate = m_WaveAudioDescriptor->AudioSamplingRate;

      ASDCP::MXF::InterchangeObject_list_t::iterator i;
      for ( i = essence_sub_descriptor_list.begin(); i != essence_sub_descriptor_list.end(); ++i )
	{
	  if ( (*i)->GetUL() != UL(m_Dict->ul(MDD_AudioChannelLabelSubDescriptor))
	       && (*i)->GetUL() != UL(m_Dict->ul(MDD_SoundfieldGroupLabelSubDescriptor))
	       && (*i)->GetUL() != UL(m_Dict->ul(MDD_GroupOfSoundfieldGroupsLabelSubDescriptor)) )
	    {
	      DefaultLogSink().Error("Essence sub-descriptor is not an MCALabelSubDescriptor.\n");
	      (*i)->Dump();
	    }

	  m_EssenceSubDescriptorList.push_back(*i);
	  GenRandomValue((*i)->InstanceUID);
	  m_EssenceDescriptor->SubDescriptors.push_back((*i)->InstanceUID);
	  *i = 0; // parent will only free the ones we don't keep
	}

      result = m_State.Goto_INIT();
    }

  return result;
}